

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency.hxx
# Opt level: O0

bool __thiscall
andres::graph::Adjacency<unsigned_long>::operator<
          (Adjacency<unsigned_long> *this,Adjacency<unsigned_long> *in)

{
  Adjacency<unsigned_long> *in_local;
  Adjacency<unsigned_long> *this_local;
  bool local_1;
  
  if (this->vertex_ < in->vertex_) {
    local_1 = true;
  }
  else if (this->vertex_ == in->vertex_) {
    local_1 = this->edge_ < in->edge_;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

inline bool
Adjacency<T>::operator<(
    const Adjacency<T>& in
) const {
    if(vertex_ < in.vertex_) {
        return true;
    }
    else if(vertex_ == in.vertex_) {
        return edge_ < in.edge_;
    }
    else {
        return false;
    }
}